

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall
SmallVector_ExplicitCtorLessThanStackBuffer_Test::TestBody
          (SmallVector_ExplicitCtorLessThanStackBuffer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f8;
  Message local_f0;
  size_t local_e8;
  unsigned_long local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  size_t local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  size_t local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  small_vector<int,_8UL> b;
  SmallVector_ExplicitCtorLessThanStackBuffer_Test *this_local;
  
  pstore::small_vector<int,_8UL>::small_vector((small_vector<int,_8UL> *)&gtest_ar.message_,5);
  local_6c = 5;
  local_78 = pstore::small_vector<int,_8UL>::size((small_vector<int,_8UL> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_68,"5U","b.size ()",&local_6c,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_ac = 8;
  local_b8 = pstore::small_vector<int,_8UL>::capacity((small_vector<int,_8UL> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a8,"8U","b.capacity ()",&local_ac,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_e0 = 0x14;
  local_e8 = pstore::small_vector<int,_8UL>::size_bytes
                       ((small_vector<int,_8UL> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_d8,"5U * sizeof (int)","b.size_bytes ()",&local_e0,&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pstore::small_vector<int,_8UL>::~small_vector((small_vector<int,_8UL> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST (SmallVector, ExplicitCtorLessThanStackBuffer) {
    pstore::small_vector<int, 8> const b (std::size_t{5});
    EXPECT_EQ (5U, b.size ());
    EXPECT_EQ (8U, b.capacity ());
    EXPECT_EQ (5U * sizeof (int), b.size_bytes ());
}